

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

int lj_cf_io_lines(lua_State *L)

{
  TValue *pTVar1;
  IOFileUD *pIVar2;
  TValue *pTVar3;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar4;
  
  pTVar3 = L->top;
  if (L->base == pTVar3) {
    L->top = pTVar3 + 1;
    (pTVar3->field_2).it = 0xffffffff;
  }
  pTVar3 = L->base;
  if ((pTVar3->field_2).it == 0xffffffff) {
    aVar4 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
             ((ulong)(L->glref).ptr32 + 400);
  }
  else {
    pIVar2 = io_file_open(L,"r");
    pIVar2->type = 4;
    pTVar3 = L->base;
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    aVar4 = pTVar1[-1].field_2.field_0;
  }
  (pTVar3->field_2).field_0 = aVar4;
  (pTVar3->field_2).it = 0xfffffff3;
  io_file_lines(L);
  return 1;
}

Assistant:

LJLIB_CF(io_lines)
{
  if (L->base == L->top) setnilV(L->top++);
  if (!tvisnil(L->base)) {  /* io.lines(fname) */
    IOFileUD *iof = io_file_open(L, "r");
    iof->type = IOFILE_TYPE_FILE|IOFILE_FLAG_CLOSE;
    L->top--;
    setudataV(L, L->base, udataV(L->top));
  } else {  /* io.lines() iterates over stdin. */
    setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_INPUT));
  }
  return io_file_lines(L);
}